

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

type __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
as<(anonymous_namespace)::ns::Color>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  enum_type eVar1;
  Color val;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_000000d8;
  
  eVar1 = json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_(anonymous_namespace)::ns::Color,_void>
          ::as(in_stack_000000d8);
  return eVar1;
}

Assistant:

typename std::enable_if<is_json_type_traits_specialized<basic_json,T>::value,T>::type
        as() const
        {
            T val = json_type_traits<basic_json,T>::as(*this);
            return val;
        }